

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

data_ptr_t
duckdb::StandardBufferManager::BufferAllocatorRealloc
          (PrivateAllocatorData *private_data,data_ptr_t pointer,idx_t old_size,idx_t size)

{
  Allocator *this;
  BufferPoolReservation r;
  
  if (old_size != size) {
    BufferPoolReservation::BufferPoolReservation
              (&r,ALLOCATOR,(BufferPool *)private_data[1]._vptr_PrivateAllocatorData[2]);
    r.size = old_size;
    BufferPoolReservation::Resize(&r,size);
    r.size = 0;
    this = Allocator::Get((DatabaseInstance *)private_data[1]._vptr_PrivateAllocatorData[1]);
    pointer = Allocator::ReallocateData(this,pointer,old_size,size);
    BufferPoolReservation::~BufferPoolReservation(&r);
  }
  return pointer;
}

Assistant:

data_ptr_t StandardBufferManager::BufferAllocatorRealloc(PrivateAllocatorData *private_data, data_ptr_t pointer,
                                                         idx_t old_size, idx_t size) {
	if (old_size == size) {
		return pointer;
	}
	auto &data = private_data->Cast<BufferAllocatorData>();
	BufferPoolReservation r(MemoryTag::ALLOCATOR, data.manager.GetBufferPool());
	r.size = old_size;
	r.Resize(size);
	r.size = 0;
	return Allocator::Get(data.manager.db).ReallocateData(pointer, old_size, size);
}